

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::ElementsAreMatcherImpl<const_pstore::small_vector<int,_2UL>_&>::DescribeTo
          (ElementsAreMatcherImpl<const_pstore::small_vector<int,_2UL>_&> *this,ostream *os)

{
  size_t sVar1;
  MatcherBase<const_int_&> *pMVar2;
  ostream *poVar3;
  ulong local_38;
  size_t i;
  ostream *local_18;
  ostream *os_local;
  ElementsAreMatcherImpl<const_pstore::small_vector<int,_2UL>_&> *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  sVar1 = count(this);
  if (sVar1 == 0) {
    std::operator<<(local_18,"is empty");
  }
  else {
    sVar1 = count(this);
    if (sVar1 == 1) {
      std::operator<<(local_18,"has 1 element that ");
      pMVar2 = &std::
                vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                ::operator[](&this->matchers_,0)->super_MatcherBase<const_int_&>;
      MatcherBase<const_int_&>::DescribeTo(pMVar2,local_18);
    }
    else {
      poVar3 = std::operator<<(local_18,"has ");
      sVar1 = count(this);
      Elements((ElementsAreMatcherImpl<const_pstore::small_vector<int,_2UL>_&> *)
               &stack0xffffffffffffffe0,sVar1);
      poVar3 = testing::operator<<(poVar3,(Message *)&stack0xffffffffffffffe0);
      std::operator<<(poVar3," where\n");
      Message::~Message((Message *)&stack0xffffffffffffffe0);
      for (local_38 = 0; sVar1 = count(this), local_38 != sVar1; local_38 = local_38 + 1) {
        poVar3 = std::operator<<(local_18,"element #");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_38);
        std::operator<<(poVar3," ");
        pMVar2 = &std::
                  vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                  ::operator[](&this->matchers_,local_38)->super_MatcherBase<const_int_&>;
        MatcherBase<const_int_&>::DescribeTo(pMVar2,local_18);
        sVar1 = count(this);
        if (local_38 + 1 < sVar1) {
          std::operator<<(local_18,",\n");
        }
      }
    }
  }
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const override {
    if (count() == 0) {
      *os << "is empty";
    } else if (count() == 1) {
      *os << "has 1 element that ";
      matchers_[0].DescribeTo(os);
    } else {
      *os << "has " << Elements(count()) << " where\n";
      for (size_t i = 0; i != count(); ++i) {
        *os << "element #" << i << " ";
        matchers_[i].DescribeTo(os);
        if (i + 1 < count()) {
          *os << ",\n";
        }
      }
    }
  }